

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message_field.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::MessageOneofFieldGenerator::GenerateNonInlineAccessorDefinitions
          (MessageOneofFieldGenerator *this,Printer *printer)

{
  FileDescriptor *pFVar1;
  Descriptor *this_00;
  FileDescriptor *pFVar2;
  undefined1 local_50 [8];
  Formatter format;
  Printer *printer_local;
  MessageOneofFieldGenerator *this_local;
  
  format.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)printer;
  Formatter::Formatter
            ((Formatter *)local_50,printer,
             &(this->super_MessageFieldGenerator).super_FieldGenerator.variables_);
  Formatter::operator()<>
            ((Formatter *)local_50,
             "void $classname$::set_allocated_$name$($type$* $name$) {\n  ::$proto_ns$::Arena* message_arena = GetArenaForAllocation();\n  clear_$oneof_name$();\n  if ($name$) {\n"
            );
  pFVar1 = FieldDescriptor::file
                     ((this->super_MessageFieldGenerator).super_FieldGenerator.descriptor_);
  this_00 = FieldDescriptor::message_type
                      ((this->super_MessageFieldGenerator).super_FieldGenerator.descriptor_);
  pFVar2 = Descriptor::file(this_00);
  if (pFVar1 == pFVar2) {
    Formatter::operator()<>
              ((Formatter *)local_50,
               "    ::$proto_ns$::Arena* submessage_arena =\n      ::$proto_ns$::Arena::InternalHelper<$type$>::GetOwningArena($name$);\n"
              );
  }
  else {
    Formatter::operator()<>
              ((Formatter *)local_50,
               "    ::$proto_ns$::Arena* submessage_arena =\n        ::$proto_ns$::Arena::InternalHelper<\n            ::$proto_ns$::MessageLite>::GetOwningArena(\n                reinterpret_cast<::$proto_ns$::MessageLite*>($name$));\n"
              );
  }
  Formatter::operator()<>
            ((Formatter *)local_50,
             "    if (message_arena != submessage_arena) {\n      $name$ = ::$proto_ns$::internal::GetOwnedMessage(\n          message_arena, $name$, submessage_arena);\n    }\n    set_has_$name$();\n    $field_member$ = $name$;\n  }\n$annotate_set$  // @@protoc_insertion_point(field_set_allocated:$full_name$)\n}\n"
            );
  Formatter::~Formatter((Formatter *)local_50);
  return;
}

Assistant:

void MessageOneofFieldGenerator::GenerateNonInlineAccessorDefinitions(
    io::Printer* printer) const {
  Formatter format(printer, variables_);
  format(
      "void $classname$::set_allocated_$name$($type$* $name$) {\n"
      "  ::$proto_ns$::Arena* message_arena = GetArenaForAllocation();\n"
      "  clear_$oneof_name$();\n"
      "  if ($name$) {\n");
  if (descriptor_->file() != descriptor_->message_type()->file()) {
    // We have to read the arena through the virtual method, because the type
    // isn't defined in this file.
    format(
        "    ::$proto_ns$::Arena* submessage_arena =\n"
        "        ::$proto_ns$::Arena::InternalHelper<\n"
        "            ::$proto_ns$::MessageLite>::GetOwningArena(\n"
        "                reinterpret_cast<::$proto_ns$::MessageLite*>("
        "$name$));\n");
  } else {
    format(
        "    ::$proto_ns$::Arena* submessage_arena =\n"
        "      ::$proto_ns$::Arena::InternalHelper<"
        "$type$>::GetOwningArena($name$);\n");
  }
  format(
      "    if (message_arena != submessage_arena) {\n"
      "      $name$ = ::$proto_ns$::internal::GetOwnedMessage(\n"
      "          message_arena, $name$, submessage_arena);\n"
      "    }\n"
      "    set_has_$name$();\n"
      "    $field_member$ = $name$;\n"
      "  }\n"
      "$annotate_set$"
      "  // @@protoc_insertion_point(field_set_allocated:$full_name$)\n"
      "}\n");
}